

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

float * stbi__loadf_main(stbi__context *s,int *x,int *y,int *comp,int req_comp)

{
  int a;
  int b;
  int iVar1;
  float *pfVar2;
  uchar *__ptr;
  int *piVar3;
  long lVar4;
  ulong uVar5;
  uint uVar6;
  uchar *puVar7;
  stbi__result_info *in_R9;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  float *pfVar11;
  double dVar12;
  
  iVar1 = stbi__hdr_test(s);
  if (iVar1 == 0) {
    piVar3 = comp;
    iVar1 = req_comp;
    __ptr = stbi__load_and_postprocess_8bit(s,x,y,comp,req_comp);
    if (__ptr == (uchar *)0x0) {
      stbi__g_failure_reason = "unknown image type";
    }
    else {
      a = *x;
      b = *y;
      if (req_comp == 0) {
        req_comp = *comp;
      }
      pfVar2 = (float *)stbi__malloc_mad4(a,b,req_comp,(int)piVar3,iVar1);
      if (pfVar2 != (float *)0x0) {
        uVar6 = b * a;
        if (0 < (int)uVar6) {
          uVar8 = (req_comp + (req_comp & 1U)) - 1;
          lVar9 = (long)req_comp;
          uVar10 = 0;
          puVar7 = __ptr;
          pfVar11 = pfVar2;
          do {
            uVar5 = 0;
            if (0 < (int)uVar8) {
              uVar5 = 0;
              do {
                dVar12 = pow((double)((float)puVar7[uVar5] / 255.0),(double)stbi__l2h_gamma);
                pfVar11[uVar5] = (float)((double)stbi__l2h_scale * dVar12);
                uVar5 = uVar5 + 1;
              } while (uVar8 != uVar5);
            }
            if ((int)uVar5 < req_comp) {
              lVar4 = (long)(int)uVar5 + uVar10 * lVar9;
              pfVar2[lVar4] = (float)__ptr[lVar4] / 255.0;
            }
            uVar10 = uVar10 + 1;
            pfVar11 = pfVar11 + lVar9;
            puVar7 = puVar7 + lVar9;
          } while (uVar10 != uVar6);
        }
        free(__ptr);
        return pfVar2;
      }
      free(__ptr);
      stbi__g_failure_reason = "outofmem";
    }
    pfVar2 = (float *)0x0;
  }
  else {
    pfVar2 = stbi__hdr_load(s,x,y,comp,req_comp,in_R9);
    if ((pfVar2 != (float *)0x0) && (stbi__vertically_flip_on_load != 0)) {
      if (req_comp == 0) {
        req_comp = *comp;
      }
      stbi__vertical_flip(pfVar2,*x,*y,req_comp << 2);
    }
  }
  return pfVar2;
}

Assistant:

static float *stbi__loadf_main(stbi__context *s, int *x, int *y, int *comp, int req_comp)
{
   unsigned char *data;
   #ifndef STBI_NO_HDR
   if (stbi__hdr_test(s)) {
      stbi__result_info ri;
      float *hdr_data = stbi__hdr_load(s,x,y,comp,req_comp, &ri);
      if (hdr_data)
         stbi__float_postprocess(hdr_data,x,y,comp,req_comp);
      return hdr_data;
   }
   #endif
   data = stbi__load_and_postprocess_8bit(s, x, y, comp, req_comp);
   if (data)
      return stbi__ldr_to_hdr(data, *x, *y, req_comp ? req_comp : *comp);
   return stbi__errpf("unknown image type", "Image not of any known type, or corrupt");
}